

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

IterateResult __thiscall VertexAttrib64Bit::ApiErrorsTest::iterate(ApiErrorsTest *this)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  bool result;
  
  iVar1 = (*((this->super_Base).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  memcpy(&(this->super_Base).gl,(void *)CONCAT44(extraout_var,iVar1),0x1a28);
  result = true;
  Base::RequireExtension(&this->super_Base,"GL_ARB_vertex_attrib_64bit");
  (*(this->super_Base).gl.genVertexArrays)(1,&this->m_vertex_array_object_id);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x170);
  (*(this->super_Base).gl.bindVertexArray)(this->m_vertex_array_object_id);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x173);
  invalidEnum(this,&result);
  invalidOperation(this,&result);
  invalidValue(this,&result);
  Base::IterateStop(&this->super_Base,result);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ApiErrorsTest::iterate()
{
	IterateStart();

	bool result = true;

	RequireExtension("GL_ARB_vertex_attrib_64bit");

	gl.genVertexArrays(1, &m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");

	gl.bindVertexArray(m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArray");

	invalidEnum(result);
	invalidOperation(result);
	invalidValue(result);

	/* Done */
	return IterateStop(result);
}